

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::defaultListTests
               (ostream *out,ColourImpl *streamColour,
               vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
               bool isFiltered,Verbosity verbosity)

{
  TestCaseInfo *pTVar1;
  pointer pTVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  pointer pTVar8;
  char *pcVar9;
  TestCaseHandle *test;
  StringRef s;
  ColourGuard colourGuard;
  Column local_98;
  ColourImpl *local_60;
  pointer local_58;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SourceLineInfo>::value,_std::string> local_50;
  
  uVar7 = (ulong)isFiltered;
  local_60 = streamColour;
  if (verbosity != Quiet) {
    pcVar9 = "All available test cases:\n";
    if (isFiltered) {
      pcVar9 = "Matching test cases:\n";
    }
    std::operator<<(out,pcVar9);
    local_58 = (tests->
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar8 = (tests->
                  super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)
                  ._M_impl.super__Vector_impl_data._M_start; pTVar8 != local_58; pTVar8 = pTVar8 + 1
        ) {
      pTVar1 = pTVar8->m_info;
      uVar4 = 0x17;
      if ((pTVar1->properties & IsHidden) == None) {
        uVar4 = 0;
      }
      local_98.m_string._M_dataplus._M_p = (pointer)local_60;
      local_98.m_string._M_string_length._0_5_ = (uint5)uVar4;
      ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_98,out);
      colourGuard.m_colourImpl = (ColourImpl *)local_98.m_string._M_dataplus._M_p;
      colourGuard.m_code = (Code)local_98.m_string._M_string_length;
      colourGuard.m_engaged = (bool)local_98.m_string._M_string_length._4_1_;
      local_98.m_string._M_string_length._0_5_ = (uint5)(Code)local_98.m_string._M_string_length;
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_98);
      TextFlow::Column::Column(&local_98,&pTVar1->name);
      local_98.m_indent = 2;
      TextFlow::operator<<(out,&local_98);
      std::operator<<(out,'\n');
      std::__cxx11::string::~string((string *)&local_98);
      if (1 < (int)verbosity) {
        StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>
                  (&local_50,&pTVar1->lineInfo);
        TextFlow::Column::Column(&local_98,&local_50);
        local_98.m_indent = 4;
        TextFlow::operator<<(out,&local_98);
        std::operator<<(out,'\n');
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if ((0 < (int)verbosity) &&
         ((pTVar1->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pTVar1->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        TestCaseInfo::tagsAsString_abi_cxx11_(&local_50,pTVar1);
        TextFlow::Column::Column(&local_98,&local_50);
        local_98.m_indent = 6;
        TextFlow::operator<<(out,&local_98);
        std::operator<<(out,'\n');
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_50);
      }
      ColourImpl::ColourGuard::~ColourGuard(&colourGuard);
    }
    if (isFiltered) {
      lVar5 = (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_98.m_string._M_string_length = 0x25c64b;
      local_98.m_string.field_2._M_allocated_capacity = 0x12;
    }
    else {
      lVar5 = (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(tests->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_98.m_string._M_string_length = 0x25c654;
      local_98.m_string.field_2._M_allocated_capacity = 9;
    }
    local_98.m_string._M_dataplus._M_p = (pointer)(lVar5 >> 4);
    operator<<(out,(pluralise *)&local_98);
    std::operator<<(out,"\n\n");
    std::ostream::flush();
    return;
  }
  pTVar2 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar8 = (tests->
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar8 != pTVar2; pTVar8 = pTVar8 + 1) {
    pTVar1 = pTVar8->m_info;
    s.m_size = 0x23;
    s.m_start = (char *)(pTVar1->name)._M_string_length;
    bVar3 = startsWith((Catch *)(pTVar1->name)._M_dataplus._M_p,s,(char)uVar7);
    if (bVar3) {
      poVar6 = std::operator<<(out,'\"');
      poVar6 = std::operator<<(poVar6,(string *)pTVar1);
      std::operator<<(poVar6,'\"');
    }
    else {
      std::operator<<(out,(string *)pTVar1);
    }
    std::operator<<(out,'\n');
  }
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTests(std::ostream& out, ColourImpl* streamColour, std::vector<TestCaseHandle> const& tests, bool isFiltered, Verbosity verbosity) {
        // We special case this to provide the equivalent of old
        // `--list-test-names-only`, which could then be used by the
        // `--input-file` option.
        if (verbosity == Verbosity::Quiet) {
            listTestNamesOnly(out, tests);
            return;
        }

        if (isFiltered) {
            out << "Matching test cases:\n";
        } else {
            out << "All available test cases:\n";
        }

        for (auto const& test : tests) {
            auto const& testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            auto colourGuard = streamColour->guardColour( colour ).engage( out );

            out << TextFlow::Column(testCaseInfo.name).indent(2) << '\n';
            if (verbosity >= Verbosity::High) {
                out << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << '\n';
            }
            if (!testCaseInfo.tags.empty() &&
                verbosity > Verbosity::Quiet) {
                out << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (isFiltered) {
            out << pluralise(tests.size(), "matching test case"_sr);
        } else {
            out << pluralise(tests.size(), "test case"_sr);
        }
        out << "\n\n" << std::flush;
    }